

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_IsoSimulateBack(Gia_IsoMan_t *p,int Iter)

{
  ulong uVar1;
  int iObj;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  
  for (iVar7 = 0; pGVar6 = p->pGia, iVar7 < pGVar6->vCos->nSize; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCo(pGVar6,iVar7);
    pGVar6 = p->pGia;
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iObj = Gia_ObjId(pGVar6,pGVar4);
    uVar3 = pGVar4->Value;
    uVar2 = Gia_IsoUpdate(p,Iter,iObj,*(uint *)pGVar4 >> 0x1d & 1);
    pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value =
         pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value + uVar2 + uVar3;
  }
  iVar7 = pGVar6->nObjs;
  while (1 < iVar7) {
    iVar7 = iVar7 + -1;
    pGVar4 = Gia_ManObj(p->pGia,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar3 = (uint)*(undefined8 *)pGVar4;
    if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
      uVar2 = pGVar4->Value;
      uVar3 = Gia_IsoUpdate(p,Iter,iVar7,uVar3 >> 0x1d & 1);
      uVar1 = *(ulong *)pGVar4;
      pGVar4[-(uVar1 & 0x1fffffff)].Value = pGVar4[-(uVar1 & 0x1fffffff)].Value + uVar3 + uVar2;
      uVar3 = pGVar4->Value;
      uVar2 = Gia_IsoUpdate(p,Iter,iVar7,(uint)(uVar1 >> 0x3d) & 1);
      pGVar4[-((ulong)*(uint *)&pGVar4->field_0x4 & 0x1fffffff)].Value =
           pGVar4[-((ulong)*(uint *)&pGVar4->field_0x4 & 0x1fffffff)].Value + uVar2 + uVar3;
    }
  }
  iVar7 = 0;
  while( true ) {
    pGVar6 = p->pGia;
    if (pGVar6->nRegs <= iVar7) {
      return;
    }
    pGVar4 = Gia_ManCo(pGVar6,(pGVar6->vCos->nSize - pGVar6->nRegs) + iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar6 = p->pGia;
    pGVar5 = Gia_ManCi(pGVar6,(pGVar6->vCis->nSize - pGVar6->nRegs) + iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) {
      return;
    }
    pGVar4->Value = pGVar4->Value + pGVar5->Value;
    iVar7 = iVar7 + 1;
  }
  return;
}

Assistant:

void Gia_IsoSimulateBack( Gia_IsoMan_t * p, int Iter )
{
    Gia_Obj_t * pObj, * pObjF;
    int i, iObj;
    // simulate COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        Gia_ObjFanin0(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, iObj, Gia_ObjFaninC0(pObj));
    }
    // simulate objects
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        Gia_ObjFanin0(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, i, Gia_ObjFaninC0(pObj));
        Gia_ObjFanin1(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, i, Gia_ObjFaninC1(pObj));
    }
    // transfer flop values
    Gia_ManForEachRiRo( p->pGia, pObjF, pObj, i )
        pObjF->Value += pObj->Value;
}